

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_memory.c
# Opt level: O0

int archive_write_open_memory(archive *a,void *buff,size_t buffSize,size_t *used)

{
  void *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined1 *in_RSI;
  archive *in_RDI;
  void *unaff_retaddr;
  write_memory_data *mine;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  __s = malloc(0x20);
  if (__s == (void *)0x0) {
    archive_set_error(in_RDI,0xc,"No memory");
    iVar1 = -0x1e;
  }
  else {
    memset(__s,0,0x20);
    *(undefined1 **)((long)__s + 0x18) = in_RSI;
    *(undefined8 *)((long)__s + 8) = in_RDX;
    *(undefined8 *)((long)__s + 0x10) = in_RCX;
    iVar1 = archive_write_open((archive *)mine,unaff_retaddr,
                               (undefined1 *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                               (archive_write_callback *)in_RDI,in_RSI);
  }
  return iVar1;
}

Assistant:

int
archive_write_open_memory(struct archive *a, void *buff, size_t buffSize, size_t *used)
{
	struct write_memory_data *mine;

	mine = (struct write_memory_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	memset(mine, 0, sizeof(*mine));
	mine->buff = buff;
	mine->size = buffSize;
	mine->client_size = used;
	return (archive_write_open(a, mine,
		    memory_write_open, memory_write, memory_write_close));
}